

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int inflateReset2(z_streamp strm,int windowBits)

{
  internal_state *piVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      if ((uint)windowBits < 0xfffffff1) {
        return -2;
      }
      iVar2 = 0;
      uVar3 = -windowBits;
    }
    else {
      iVar2 = ((uint)windowBits >> 4) + 5;
      uVar3 = windowBits & 0xf;
      if (0x2f < (uint)windowBits) {
        uVar3 = windowBits;
      }
    }
    if ((uVar3 - 8 < 8) || (uVar3 == 0)) {
      if ((*(voidpf *)&piVar1->method != (voidpf)0x0) && (*(uint *)&piVar1->gzhead != uVar3)) {
        (*strm->zfree)(strm->opaque,*(voidpf *)&piVar1->method);
        piVar1->method = '\0';
        *(undefined3 *)&piVar1->field_0x49 = 0;
        piVar1->last_flush = 0;
      }
      *(int *)&piVar1->pending_buf = iVar2;
      *(uint *)&piVar1->gzhead = uVar3;
      iVar2 = inflateReset(strm);
      return iVar2;
    }
  }
  return -2;
}

Assistant:

int ZEXPORT inflateReset2(z_streamp strm, int windowBits) {
    int wrap;
    struct inflate_state FAR *state;

    /* get the state */
    if (inflateStateCheck(strm)) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        if (windowBits < -15)
            return Z_STREAM_ERROR;
        wrap = 0;
        windowBits = -windowBits;
    }
    else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= 15;
#endif
    }

    /* set number of window bits, free window if different */
    if (windowBits && (windowBits < 8 || windowBits > 15))
        return Z_STREAM_ERROR;
    if (state->window != Z_NULL && state->wbits != (unsigned)windowBits) {
        ZFREE(strm, state->window);
        state->window = Z_NULL;
    }

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return inflateReset(strm);
}